

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

Response execute_command(DatasetDropCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  string *parameter;
  DatasetDropCommand *in_RSI;
  DBChange *in_RDI;
  Response RVar1;
  DBChange *in_stack_ffffffffffffff28;
  DBChange *this;
  string *obj_name;
  DbChangeType *in_stack_ffffffffffffff58;
  DBChange *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  
  this = in_RDI;
  parameter = DatasetDropCommand::dataset_id_abi_cxx11_(in_RSI);
  obj_name = (string *)&stack0xffffffffffffff6f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator<char> *)in_stack_ffffffffffffff60);
  DBChange::DBChange(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,obj_name,parameter);
  Task::change((Task *)this,in_stack_ffffffffffffff28);
  DBChange::~DBChange(this);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff6f);
  RVar1 = Response::ok();
  RVar1.content._0_8_ = in_RDI;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command(const DatasetDropCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    task->change(DBChange(DbChangeType::Drop, cmd.dataset_id()));

    return Response::ok();
}